

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O1

void __thiscall
duckdb::PartitionedTupleData::BuildBufferSpace<true>
          (PartitionedTupleData *this,PartitionedTupleDataAppendState *state)

{
  _Head_base<0UL,_duckdb::list_entry_t_*,_false> _Var1;
  idx_t append_count;
  TupleDataSegment *segment;
  type this_00;
  pointer pTVar2;
  long lVar3;
  long lVar4;
  const_iterator it;
  fixed_size_map_iterator<duckdb::list_entry_t,_true> local_50;
  fixed_size_map_t<duckdb::list_entry_t> *local_38;
  
  local_50.map = &state->fixed_partition_entries;
  local_50.entry_idx = 0;
  local_50.idx_in_entry = 0;
  local_38 = local_50.map;
  if ((*(state->fixed_partition_entries).occupied.validity_mask & 1) == 0) {
    fixed_size_map_iterator<duckdb::list_entry_t,_true>::operator++(&local_50);
  }
  if (((uint)local_38->capacity & 7) != local_50.idx_in_entry ||
      local_38->capacity >> 3 != local_50.entry_idx) {
    do {
      lVar3 = local_50.idx_in_entry + local_50.entry_idx * 8;
      this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                ::operator*((this->partitions).
                            super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar3);
      lVar4 = 0;
      for (pTVar2 = (this_00->segments).
                    super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                    .
                    super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar2 != (this_00->segments).
                    super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                    .
                    super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
        lVar4 = lVar4 + pTVar2->data_size;
      }
      _Var1._M_head_impl =
           ((local_50.map)->values).
           super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>
           .super__Head_base<0UL,_duckdb::list_entry_t_*,_false>._M_head_impl;
      append_count = *(idx_t *)((long)(_Var1._M_head_impl +
                                      local_50.entry_idx * 8 + local_50.idx_in_entry) + 8);
      TupleDataCollection::Build
                (this_00,(state->partition_pin_states).
                         super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                         .
                         super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar3,&state->chunk_state,
                 _Var1._M_head_impl[local_50.entry_idx * 8 + local_50.idx_in_entry].offset -
                 append_count,append_count);
      lVar3 = 0;
      for (pTVar2 = (this_00->segments).
                    super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                    .
                    super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar2 != (this_00->segments).
                    super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                    .
                    super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
        lVar3 = lVar3 + pTVar2->data_size;
      }
      this->data_size = this->data_size + (lVar3 - lVar4);
      fixed_size_map_iterator<duckdb::list_entry_t,_true>::operator++(&local_50);
    } while (((uint)local_38->capacity & 7) != local_50.idx_in_entry ||
             local_38->capacity >> 3 != local_50.entry_idx);
  }
  return;
}

Assistant:

void PartitionedTupleData::BuildBufferSpace(PartitionedTupleDataAppendState &state) {
	using GETTER = TemplatedMapGetter<list_entry_t, fixed>;
	const auto &partition_entries = state.GetMap<fixed>();
	for (auto it = partition_entries.begin(); it != partition_entries.end(); ++it) {
		const auto &partition_index = GETTER::GetKey(it);

		// Partition, pin state for this partition index
		auto &partition = *partitions[partition_index];
		auto &partition_pin_state = state.partition_pin_states[partition_index];

		// Length and offset for this partition
		const auto &partition_entry = GETTER::GetValue(it);
		const auto &partition_length = partition_entry.length;
		const auto partition_offset = partition_entry.offset - partition_length;

		// Build out the buffer space for this partition
		const auto size_before = partition.SizeInBytes();
		partition.Build(partition_pin_state, state.chunk_state, partition_offset, partition_length);
		data_size += partition.SizeInBytes() - size_before;
	}
}